

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O1

int __thiscall Backpack::remove(Backpack *this,char *__filename)

{
  pointer *pppBVar1;
  pointer ppBVar2;
  pointer ppBVar3;
  void *pvVar4;
  
  pvVar4 = (void *)((ulong)__filename & 0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"class:Backpack method:remove\n",0x1d);
  if (0 < (int)__filename) {
    ppBVar2 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppBVar3 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar4 <= (void *)((long)ppBVar3 - (long)ppBVar2 >> 3)) {
      ppBVar2 = ppBVar2 + (long)pvVar4;
      if (ppBVar2 != ppBVar3) {
        pvVar4 = memmove(ppBVar2 + -1,ppBVar2,(long)ppBVar3 - (long)ppBVar2);
      }
      pppBVar1 = &(this->backpack).
                  super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + -1;
      return (int)CONCAT71((int7)((ulong)pvVar4 >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool Backpack::remove(int index) {
    std::cout << "class:Backpack method:remove\n";
    if (index <= 0 || index > backpack.size()) {
        return false;
    }
    backpack.erase(backpack.begin() + index - 1);
    return true;
}